

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O3

int ccm_auth_crypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                  uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ulong __n;
  ulong uVar9;
  uchar *puVar10;
  size_t sVar11;
  bool bVar12;
  uchar y [16];
  uchar ctr [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_9c;
  mbedtls_cipher_context_t *local_98;
  size_t local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_6c;
  uchar local_68 [15];
  undefined1 local_59;
  ulong local_50;
  uchar *local_48;
  size_t local_40;
  uchar *local_38;
  
  iVar4 = -0xd;
  if ((((add_len < 0xff01) && (0xfffffffffffffff8 < iv_len - 0xe)) &&
      (0xfffffffffffffff2 < tag_len - 0x11)) && ((tag_len & 1) == 0)) {
    bVar2 = 0xf - (char)iv_len;
    __n = (ulong)bVar2;
    local_6c = bVar2 - 1;
    local_b8 = CONCAT71(local_b8._1_7_,
                        (add_len != 0) << 6 | (char)tag_len * '\x04' - 8U & 0xf8 | (byte)local_6c);
    local_9c = mode;
    local_50 = length;
    local_40 = iv_len;
    local_38 = iv;
    memcpy((void *)((long)&local_b8 + 1),iv,iv_len);
    lVar6 = 0;
    uVar9 = local_50;
    do {
      uVar7 = uVar9;
      *(char *)((long)&uStack_b0 + lVar6 + 7) = (char)uVar7;
      lVar6 = lVar6 + -1;
      uVar9 = uVar7 >> 8;
    } while (-lVar6 != __n);
    if (uVar7 < 0x100) {
      local_88 = local_b8;
      uStack_80 = uStack_b0;
      iVar4 = mbedtls_cipher_update
                        (&ctx->cipher_ctx,(uchar *)&local_88,0x10,(uchar *)&local_88,&local_90);
      if (iVar4 == 0) {
        local_98 = &ctx->cipher_ctx;
        if (add_len != 0) {
          uStack_b0 = 0;
          local_b8 = (ulong)CONCAT11((char)add_len,(char)(add_len >> 8));
          sVar11 = 0xe;
          if (add_len < 0xe) {
            sVar11 = add_len;
          }
          local_48 = add;
          memcpy((void *)((long)&local_b8 + 2),add,sVar11);
          local_88 = CONCAT44(local_88._4_4_ ^ local_b8._4_4_,(uint)local_88 ^ (uint)local_b8);
          uStack_80 = CONCAT44(uStack_80._4_4_ ^ uStack_b0._4_4_,(uint)uStack_80 ^ (uint)uStack_b0);
          iVar4 = mbedtls_cipher_update
                            (local_98,(uchar *)&local_88,0x10,(uchar *)&local_88,&local_90);
          if (iVar4 != 0) {
            return iVar4;
          }
          uVar9 = add_len - sVar11;
          if (uVar9 != 0) {
            puVar10 = local_48 + sVar11;
            do {
              sVar11 = 0x10;
              if (uVar9 < 0x10) {
                sVar11 = uVar9;
              }
              sVar8 = 0;
              if (uVar9 < 0x10) {
                sVar8 = 0x10 - sVar11;
              }
              memset((void *)((long)&local_b8 + sVar11),0,sVar8);
              memcpy(&local_b8,puVar10,sVar11);
              local_88 = CONCAT44(local_88._4_4_ ^ local_b8._4_4_,(uint)local_88 ^ (uint)local_b8);
              uStack_80 = CONCAT44(uStack_80._4_4_ ^ uStack_b0._4_4_,
                                   (uint)uStack_80 ^ (uint)uStack_b0);
              iVar4 = mbedtls_cipher_update
                                (local_98,(uchar *)&local_88,0x10,(uchar *)&local_88,&local_90);
              if (iVar4 != 0) {
                return iVar4;
              }
              puVar10 = puVar10 + sVar11;
              uVar9 = uVar9 - sVar11;
            } while (uVar9 != 0);
          }
        }
        sVar1 = local_40;
        local_68[0] = (uchar)local_6c;
        memcpy(local_68 + 1,local_38,local_40);
        memset(local_68 + sVar1 + 1,0,__n);
        local_59 = 1;
        uVar9 = local_50;
joined_r0x001312ac:
        if (uVar9 != 0) {
          sVar11 = 0x10;
          if (uVar9 < 0x10) {
            sVar11 = uVar9;
          }
          if (local_9c == 0) {
            sVar8 = 0;
            if (uVar9 < 0x10) {
              sVar8 = 0x10 - sVar11;
            }
            memset((void *)((long)&local_b8 + sVar11),0,sVar8);
            memcpy(&local_b8,input,sVar11);
            local_88 = CONCAT44(local_88._4_4_ ^ local_b8._4_4_,(uint)local_88 ^ (uint)local_b8);
            uStack_80 = CONCAT44(uStack_80._4_4_ ^ uStack_b0._4_4_,(uint)uStack_80 ^ (uint)uStack_b0
                                );
            iVar4 = mbedtls_cipher_update
                              (local_98,(uchar *)&local_88,0x10,(uchar *)&local_88,&local_90);
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          iVar4 = mbedtls_cipher_update(local_98,local_68,0x10,(uchar *)&local_b8,&local_90);
          if (iVar4 != 0) {
            return iVar4;
          }
          lVar6 = 0;
          do {
            output[lVar6] = *(byte *)((long)&local_b8 + lVar6) ^ input[lVar6];
            lVar6 = lVar6 + 1;
          } while (sVar11 + (sVar11 == 0) != lVar6);
          if (local_9c == 1) {
            sVar8 = 0;
            if (uVar9 < 0x10) {
              sVar8 = 0x10 - sVar11;
            }
            memset((void *)((long)&local_b8 + sVar11),0,sVar8);
            memcpy(&local_b8,output,sVar11);
            local_88 = CONCAT44(local_88._4_4_ ^ local_b8._4_4_,(uint)local_88 ^ (uint)local_b8);
            uStack_80 = CONCAT44(uStack_80._4_4_ ^ uStack_b0._4_4_,(uint)uStack_80 ^ (uint)uStack_b0
                                );
            iVar4 = mbedtls_cipher_update
                              (local_98,(uchar *)&local_88,0x10,(uchar *)&local_88,&local_90);
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          output = output + sVar11;
          input = input + sVar11;
          uVar9 = uVar9 - sVar11;
          uVar5 = 0xf;
          uVar7 = 1;
          do {
            puVar10 = local_68 + (uVar5 & 0xffffffff);
            *puVar10 = *puVar10 + '\x01';
            if (*puVar10 != '\0') break;
            uVar5 = uVar5 - 1;
            bVar12 = uVar7 < __n;
            uVar7 = uVar7 + 1;
          } while (bVar12);
          goto joined_r0x001312ac;
        }
        bVar3 = 1;
        if (1 < bVar2) {
          bVar3 = bVar2;
        }
        uVar9 = 0xf;
        do {
          local_68[uVar9 & 0xffffffff] = '\0';
          lVar6 = bVar3 + uVar9;
          uVar9 = uVar9 - 1;
        } while (lVar6 != 0x10);
        iVar4 = mbedtls_cipher_update(local_98,local_68,0x10,(uchar *)&local_b8,&local_90);
        if (iVar4 == 0) {
          local_88 = CONCAT44(local_b8._4_4_ ^ local_88._4_4_,(uint)local_b8 ^ (uint)local_88);
          uStack_80 = CONCAT44(uStack_b0._4_4_ ^ uStack_80._4_4_,(uint)uStack_b0 ^ (uint)uStack_80);
          memcpy(tag,&local_88,tag_len);
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int ccm_auth_crypt( mbedtls_ccm_context *ctx, int mode, size_t length,
                           const unsigned char *iv, size_t iv_len,
                           const unsigned char *add, size_t add_len,
                           const unsigned char *input, unsigned char *output,
                           unsigned char *tag, size_t tag_len )
{
    int ret;
    unsigned char i;
    unsigned char q;
    size_t len_left, olen;
    unsigned char b[16];
    unsigned char y[16];
    unsigned char ctr[16];
    const unsigned char *src;
    unsigned char *dst;

    /*
     * Check length requirements: SP800-38C A.1
     * Additional requirement: a < 2^16 - 2^8 to simplify the code.
     * 'length' checked later (when writing it to the first block)
     */
    if( tag_len < 4 || tag_len > 16 || tag_len % 2 != 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    /* Also implies q is within bounds */
    if( iv_len < 7 || iv_len > 13 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    if( add_len > 0xFF00 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    q = 16 - 1 - (unsigned char) iv_len;

    /*
     * First block B_0:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       length
     *
     * With flags as (bits):
     * 7        0
     * 6        add present?
     * 5 .. 3   (t - 2) / 2
     * 2 .. 0   q - 1
     */
    b[0] = 0;
    b[0] |= ( add_len > 0 ) << 6;
    b[0] |= ( ( tag_len - 2 ) / 2 ) << 3;
    b[0] |= q - 1;

    memcpy( b + 1, iv, iv_len );

    for( i = 0, len_left = length; i < q; i++, len_left >>= 8 )
        b[15-i] = (unsigned char)( len_left & 0xFF );

    if( len_left > 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );


    /* Start CBC-MAC with first block */
    memset( y, 0, 16 );
    UPDATE_CBC_MAC;

    /*
     * If there is additional data, update CBC-MAC with
     * add_len, add, 0 (padding to a block boundary)
     */
    if( add_len > 0 )
    {
        size_t use_len;
        len_left = add_len;
        src = add;

        memset( b, 0, 16 );
        b[0] = (unsigned char)( ( add_len >> 8 ) & 0xFF );
        b[1] = (unsigned char)( ( add_len      ) & 0xFF );

        use_len = len_left < 16 - 2 ? len_left : 16 - 2;
        memcpy( b + 2, src, use_len );
        len_left -= use_len;
        src += use_len;

        UPDATE_CBC_MAC;

        while( len_left > 0 )
        {
            use_len = len_left > 16 ? 16 : len_left;

            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;

            len_left -= use_len;
            src += use_len;
        }
    }

    /*
     * Prepare counter block for encryption:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       counter (initially 1)
     *
     * With flags as (bits):
     * 7 .. 3   0
     * 2 .. 0   q - 1
     */
    ctr[0] = q - 1;
    memcpy( ctr + 1, iv, iv_len );
    memset( ctr + 1 + iv_len, 0, q );
    ctr[15] = 1;

    /*
     * Authenticate and {en,de}crypt the message.
     *
     * The only difference between encryption and decryption is
     * the respective order of authentication and {en,de}cryption.
     */
    len_left = length;
    src = input;
    dst = output;

    while( len_left > 0 )
    {
        size_t use_len = len_left > 16 ? 16 : len_left;

        if( mode == CCM_ENCRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;
        }

        CTR_CRYPT( dst, src, use_len );

        if( mode == CCM_DECRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, dst, use_len );
            UPDATE_CBC_MAC;
        }

        dst += use_len;
        src += use_len;
        len_left -= use_len;

        /*
         * Increment counter.
         * No need to check for overflow thanks to the length check above.
         */
        for( i = 0; i < q; i++ )
            if( ++ctr[15-i] != 0 )
                break;
    }

    /*
     * Authentication: reset counter and crypt/mask internal tag
     */
    for( i = 0; i < q; i++ )
        ctr[15-i] = 0;

    CTR_CRYPT( y, y, 16 );
    memcpy( tag, y, tag_len );

    return( 0 );
}